

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateTestCaseUtil.hpp
# Opt level: O2

TestInstance * __thiscall
vkt::DynamicState::
InstanceFactory<vkt::DynamicState::(anonymous_namespace)::ViewportArrayTestInstance>::createInstance
          (InstanceFactory<vkt::DynamicState::(anonymous_namespace)::ViewportArrayTestInstance>
           *this,Context *context)

{
  DynamicStateBaseClass *pDVar1;
  char *vertexShaderName;
  DynamicStateBaseClass *this_00;
  mapped_type *ppcVar2;
  VkPhysicalDeviceFeatures *pVVar3;
  NotSupportedError *pNVar4;
  int i;
  int iVar5;
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  *this_01;
  RGBA local_bc;
  Vec4 local_b8;
  DynamicStateBaseClass *local_a8;
  float local_9c;
  DynamicStateBaseClass *local_98;
  string local_90;
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  local_70;
  Vec4 local_40;
  
  this_00 = (DynamicStateBaseClass *)operator_new(0x1c8);
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::_Rb_tree(&local_70,&(this->m_shaderPaths)._M_t);
  local_90._M_dataplus._M_p._0_4_ = 0;
  ppcVar2 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                          *)&local_70,(key_type *)&local_90);
  vertexShaderName = *ppcVar2;
  local_b8.m_data[0] = 1.4013e-45;
  ppcVar2 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                          *)&local_70,(key_type *)&local_b8);
  DynamicStateBaseClass::DynamicStateBaseClass(this_00,context,vertexShaderName,*ppcVar2);
  (this_00->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__ViewportArrayTestInstance_00bd5a18;
  local_90._M_dataplus._M_p._0_4_ = 2;
  ppcVar2 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                          *)&local_70,(key_type *)&local_90);
  pDVar1 = this_00 + 1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)pDVar1,*ppcVar2,(allocator<char> *)&local_b8);
  pVVar3 = Context::getDeviceFeatures((this_00->super_TestInstance).m_context);
  if (pVVar3->multiViewport == 0) {
    pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"Multi-viewport is not supported",(allocator<char> *)&local_b8);
    tcu::NotSupportedError::NotSupportedError(pNVar4,&local_90);
    __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  local_a8 = pDVar1;
  if (pVVar3->geometryShader != 0) {
    this_01 = &this_00->m_data;
    local_98 = this_00;
    for (iVar5 = 0; pDVar1 = local_98, iVar5 != 4; iVar5 = iVar5 + 1) {
      local_b8.m_data[2] = (float)iVar5 / 3.0;
      local_b8.m_data[0] = -1.0;
      local_b8.m_data[1] = 1.0;
      local_b8.m_data[3] = 1.0;
      local_bc.m_value = 0xff00ff00;
      local_9c = local_b8.m_data[2];
      tcu::RGBA::toVec(&local_bc);
      PositionColorVertex::PositionColorVertex((PositionColorVertex *)&local_90,&local_b8,&local_40)
      ;
      std::
      vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
      ::emplace_back<vkt::DynamicState::PositionColorVertex>
                (this_01,(PositionColorVertex *)&local_90);
      local_b8.m_data._0_8_ = &DAT_3f8000003f800000;
      local_b8.m_data[2] = local_9c;
      local_b8.m_data[3] = 1.0;
      local_bc.m_value = 0xff00ff00;
      tcu::RGBA::toVec(&local_bc);
      PositionColorVertex::PositionColorVertex((PositionColorVertex *)&local_90,&local_b8,&local_40)
      ;
      std::
      vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
      ::emplace_back<vkt::DynamicState::PositionColorVertex>
                (this_01,(PositionColorVertex *)&local_90);
      local_b8.m_data[0] = -1.0;
      local_b8.m_data[1] = -1.0;
      local_b8.m_data[2] = local_9c;
      local_b8.m_data[3] = 1.0;
      local_bc.m_value = 0xff00ff00;
      tcu::RGBA::toVec(&local_bc);
      PositionColorVertex::PositionColorVertex((PositionColorVertex *)&local_90,&local_b8,&local_40)
      ;
      std::
      vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
      ::emplace_back<vkt::DynamicState::PositionColorVertex>
                (this_01,(PositionColorVertex *)&local_90);
      local_b8.m_data[0] = 1.0;
      local_b8.m_data[1] = -1.0;
      local_b8.m_data[2] = local_9c;
      local_b8.m_data[3] = 1.0;
      local_bc.m_value = 0xff00ff00;
      tcu::RGBA::toVec(&local_bc);
      PositionColorVertex::PositionColorVertex((PositionColorVertex *)&local_90,&local_b8,&local_40)
      ;
      std::
      vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
      ::emplace_back<vkt::DynamicState::PositionColorVertex>
                (this_01,(PositionColorVertex *)&local_90);
    }
    DynamicStateBaseClass::initialize(local_98);
    std::
    _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
    ::~_Rb_tree(&local_70);
    return &pDVar1->super_TestInstance;
  }
  pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"Geometry shaders are not supported",(allocator<char> *)&local_b8);
  tcu::NotSupportedError::NotSupportedError(pNVar4,&local_90);
  __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

TestInstance* createInstance (Context& context) const
	{
		return new Instance(context, m_shaderPaths);
	}